

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::GetTerminalAttribute
               (Stage *stage,Attribute *attr,string *attr_name,Attribute *value,string *err)

{
  Prim *prim;
  bool bVar1;
  ostream *poVar2;
  value_type *ppPVar3;
  size_type sVar4;
  error_type *peVar5;
  Attribute *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  allocator local_3a9;
  string abs_path;
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  targetPrimRet;
  string targetPrimPath;
  string local_340;
  string targetPrimPropName;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> pv;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  visited_paths;
  value_type target;
  ostringstream ss_e;
  string local_70;
  string local_50 [32];
  
  if (value == (Attribute *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"GetTerminalAttribute");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb22);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)&ss_e,"`value` arg is nullptr.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    return false;
  }
  visited_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &visited_paths._M_t._M_impl.super__Rb_tree_header._M_header;
  visited_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  visited_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  visited_paths._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args = value;
  visited_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       visited_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = Attribute::is_connection(attr);
  if (!bVar1) {
    Attribute::operator=(value,attr);
    bVar1 = true;
    goto LAB_0027b2a4;
  }
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&pv,&attr->_paths);
  if (pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start ==
      pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"GetTerminalAttribute");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb2b);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::string::string
              ((string *)&targetPrimRet,"Connection targetPath is empty for Attribute {}.",
               (allocator *)&targetPrimPath);
    fmt::format<std::__cxx11::string>
              ((string *)&target,(fmt *)&targetPrimRet,(string *)attr_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&target);
    ::std::operator<<(poVar2,"\n");
LAB_0027af01:
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    bVar1 = false;
  }
  else {
    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd0;
    if (1 < (ulong)(((long)pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0xd0)) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"GetTerminalAttribute");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb30);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::string
                ((string *)&targetPrimRet,"Multiple targetPaths assigned to .connection.",
                 (allocator *)&targetPrimPath);
      fmt::format(&target._prim_part,(string *)&targetPrimRet);
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&target);
      ::std::operator<<(poVar2,"\n");
      goto LAB_0027af01;
    }
    Path::Path(&target,pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    ::std::__cxx11::string::string((string *)&targetPrimPath,(string *)&target);
    ::std::__cxx11::string::string((string *)&targetPrimPropName,(string *)&target._prop_part);
    ::std::__cxx11::string::string((string *)&abs_path,"",(allocator *)&local_340);
    Path::Path((Path *)&ss_e,&targetPrimPath,&abs_path);
    Stage::GetPrimAtPath_abi_cxx11_(&targetPrimRet,stage,(Path *)&ss_e);
    Path::~Path((Path *)&ss_e);
    ::std::__cxx11::string::_M_dispose();
    if (targetPrimRet.contained.
        super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value == true) {
      ppPVar3 = nonstd::expected_lite::
                expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value(&targetPrimRet);
      prim = *ppPVar3;
      Path::full_path_name_abi_cxx11_(&abs_path,&target);
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&visited_paths,&abs_path);
      if (sVar4 == 0) {
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&visited_paths,&abs_path);
        bVar1 = anon_unknown_6::GetTerminalAttributeImpl
                          (stage,prim,&targetPrimPropName,value,err,&visited_paths);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"GetTerminalAttribute");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb46);
        ::std::operator<<(poVar2," ");
        ::std::__cxx11::string::string
                  (local_50,"Circular referencing detected. connectionTargetPath = {}",&local_3a9);
        tinyusdz::to_string_abi_cxx11_(&local_70,(tinyusdz *)&target,(Path *)0x1,SUB81(args_00,0));
        fmt::format<std::__cxx11::string>(&local_340,(fmt *)local_50,(string *)&local_70,args_00);
        poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_340);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)err);
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        bVar1 = false;
      }
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"GetTerminalAttribute");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb4e);
      ::std::operator<<(poVar2," ");
      peVar5 = nonstd::expected_lite::
               expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error(&targetPrimRet);
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)peVar5);
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      bVar1 = false;
    }
    nonstd::expected_lite::
    expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~expected(&targetPrimRet);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    Path::~Path(&target);
  }
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&pv);
LAB_0027b2a4:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&visited_paths);
  return bVar1;
}

Assistant:

bool GetTerminalAttribute(const tinyusdz::Stage &stage,
                          const tinyusdz::Attribute &attr,
                          const std::string &attr_name, Attribute *value,
                          std::string *err) {
  if (!value) {
    PUSH_ERROR_AND_RETURN("`value` arg is nullptr.");
  }

  std::set<std::string> visited_paths;

  if (attr.is_connection()) {
    std::vector<Path> pv = attr.connections();
    if (pv.empty()) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Connection targetPath is empty for Attribute {}.", attr_name));
    }

    if (pv.size() > 1) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Multiple targetPaths assigned to .connection."));
    }

    auto target = pv[0];

    std::string targetPrimPath = target.prim_part();
    std::string targetPrimPropName = target.prop_part();
    DCOUT("connection targetPath : " << target << "(Prim: " << targetPrimPath
                                     << ", Prop: " << targetPrimPropName
                                     << ")");

    auto targetPrimRet =
        stage.GetPrimAtPath(Path(targetPrimPath, /* prop */ ""));
    if (targetPrimRet) {
      // Follow the connetion
      const Prim *targetPrim = targetPrimRet.value();

      std::string abs_path = target.full_path_name();

      if (visited_paths.count(abs_path)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Circular referencing detected. connectionTargetPath = {}",
            to_string(target)));
      }
      visited_paths.insert(abs_path);

      return GetTerminalAttributeImpl(stage, *targetPrim, targetPrimPropName,
                                      value, err, visited_paths);

    } else {
      PUSH_ERROR_AND_RETURN(targetPrimRet.error());
    }

  } else {
    (*value) = attr;
    return true;
  }

  return false;
}